

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O0

bool __thiscall DIS::MinefieldStatePdu::operator==(MinefieldStatePdu *this,MinefieldStatePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  ulong local_30;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  MinefieldStatePdu *rhs_local;
  MinefieldStatePdu *this_local;
  
  idx._7_1_ = MinefieldFamilyPdu::operator==
                        (&this->super_MinefieldFamilyPdu,&rhs->super_MinefieldFamilyPdu);
  bVar1 = MinefieldIdentifier::operator==(&this->_minefieldID,&rhs->_minefieldID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_minefieldSequence != rhs->_minefieldSequence) {
    idx._7_1_ = false;
  }
  if (this->_forceID != rhs->_forceID) {
    idx._7_1_ = false;
  }
  bVar1 = EntityType::operator==(&this->_minefieldType,&rhs->_minefieldType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Double::operator==(&this->_minefieldLocation,&rhs->_minefieldLocation);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EulerAngles::operator==(&this->_minefieldOrientation,&rhs->_minefieldOrientation);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_appearance != rhs->_appearance) {
    idx._7_1_ = false;
  }
  if (this->_protocolMode != rhs->_protocolMode) {
    idx._7_1_ = false;
  }
  idx_1 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>::size
                      (&this->_perimeterPoints);
    if (sVar2 <= idx_1) break;
    this_00 = std::vector<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>::operator[]
                        (&this->_perimeterPoints,idx_1);
    rhs_00 = std::vector<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>::operator[]
                       (&rhs->_perimeterPoints,idx_1);
    bVar1 = Vector2Float::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_1 = idx_1 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size(&this->_mineType);
    if (sVar2 <= local_30) break;
    this_01 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                        (&this->_mineType,local_30);
    rhs_01 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&rhs->_mineType,local_30);
    bVar1 = EntityType::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_30 = local_30 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool MinefieldStatePdu::operator ==(const MinefieldStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = MinefieldFamilyPdu::operator==(rhs);

     if( ! (_minefieldID == rhs._minefieldID) ) ivarsEqual = false;
     if( ! (_minefieldSequence == rhs._minefieldSequence) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_minefieldType == rhs._minefieldType) ) ivarsEqual = false;
     if( ! (_minefieldLocation == rhs._minefieldLocation) ) ivarsEqual = false;
     if( ! (_minefieldOrientation == rhs._minefieldOrientation) ) ivarsEqual = false;
     if( ! (_appearance == rhs._appearance) ) ivarsEqual = false;
     if( ! (_protocolMode == rhs._protocolMode) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _perimeterPoints.size(); idx++)
     {
        if( ! ( _perimeterPoints[idx] == rhs._perimeterPoints[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _mineType.size(); idx++)
     {
        if( ! ( _mineType[idx] == rhs._mineType[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }